

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seq.c
# Opt level: O2

size_t Qiniu_Seq_Read(void *buf,size_t unused,size_t n,Qiniu_Seq *self)

{
  ulong uVar1;
  
  uVar1 = self->limit - self->off;
  if (uVar1 == 0) {
    n = 0;
  }
  else {
    if (uVar1 < n) {
      n = uVar1;
    }
    for (uVar1 = 0; n != uVar1; uVar1 = uVar1 + 1) {
      *(char *)((long)buf + uVar1) =
           (char)((self->off + self->delta + uVar1) % (ulong)(long)self->radix) + (char)self->base;
    }
    self->off = self->off + n;
  }
  return n;
}

Assistant:

static size_t Qiniu_Seq_Read(void *buf, size_t unused, size_t n, Qiniu_Seq *self)
{
	char *p = (char *)buf;
	size_t i, max = self->limit - self->off;
	if (max <= 0)
	{
		return 0;
	}
	if (n > max)
	{
		n = (size_t)max;
	}
	for (i = 0; i < n; i++)
	{
		p[i] = (self->off + self->delta + i) % self->radix + self->base;
	}
	self->off += n;
	return n;
}